

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::FboCases::StencilTest::render(StencilTest *this,Context *ctx,Surface *dst)

{
  GLenum GVar1;
  uint uVar2;
  uint program;
  uint uVar3;
  uint uVar4;
  _func_int **pp_Var5;
  int in_R9D;
  uint local_33c;
  Vec3 local_338;
  undefined4 uStack_32c;
  Vec3 local_328;
  Surface *local_318;
  Framebuffer fbo;
  SingleTex2DShader texShader;
  FlatColorShader colorShader;
  
  FlatColorShader::FlatColorShader(&colorShader);
  SingleTex2DShader::SingleTex2DShader(&texShader);
  uVar2 = (*ctx->_vptr_Context[0x75])(ctx,&colorShader);
  local_318 = dst;
  program = (*ctx->_vptr_Context[0x75])(ctx,&texShader);
  GVar1 = (this->super_FboRenderCase).m_config.depthbufferType;
  local_33c = this->m_fboWidth;
  uVar4 = this->m_fboHeight;
  createQuadsTex2D(ctx,1,0x1907,0x40,0x40,in_R9D);
  createMetaballsTex2D(ctx,2,0x1907,0x40,0x40,in_R9D);
  Functional::Framebuffer::Framebuffer
            (&fbo,ctx,&(this->super_FboRenderCase).m_config,local_33c,uVar4,0,0,0,0);
  Functional::Framebuffer::checkCompleteness(&fbo);
  (*ctx->_vptr_Context[9])(ctx,0x8d40,(ulong)fbo.m_framebuffer);
  (*ctx->_vptr_Context[5])(ctx,0,0,(ulong)local_33c,(ulong)uVar4);
  (*ctx->_vptr_Context[0x2a])(0,0,0,0x3f800000,ctx);
  (*ctx->_vptr_Context[0x2d])(ctx,0x4500);
  (*ctx->_vptr_Context[0x33])(ctx,0xb71);
  (*ctx->_vptr_Context[0x33])(ctx,0xb90);
  (*ctx->_vptr_Context[0x35])(ctx,0x207,0,0xff);
  (*ctx->_vptr_Context[0x36])(ctx,0x1e00,0x1e00,0x1e02);
  local_338.m_data[0] = 0.0;
  local_338.m_data[1] = 0.0;
  local_338.m_data[2] = 1.0;
  uStack_32c = 0x3f800000;
  (*ctx->_vptr_Context[0x76])(ctx,(ulong)uVar2);
  uVar3 = (*ctx->_vptr_Context[0x66])(ctx,(ulong)uVar2,"u_color");
  (*ctx->_vptr_Context[0x5f])(ctx,(ulong)uVar3,1,&local_338);
  local_338.m_data[0] = -1.0;
  local_338.m_data[1] = -1.0;
  local_338.m_data[2] = 0.0;
  local_328.m_data[0] = 1.0;
  local_328.m_data[1] = 1.0;
  local_328.m_data[2] = 0.0;
  sglr::drawQuad(ctx,uVar2,&local_338,&local_328);
  (*ctx->_vptr_Context[6])(ctx,0xde1,1);
  (*ctx->_vptr_Context[0x76])(ctx,(ulong)program);
  uVar3 = (*ctx->_vptr_Context[0x66])(ctx,(ulong)program,"u_sampler0");
  (*ctx->_vptr_Context[0x5b])(ctx,(ulong)uVar3,0);
  local_338.m_data[0] = -1.0;
  local_338.m_data[1] = -1.0;
  local_338.m_data[2] = -1.0;
  local_328.m_data[0] = 1.0;
  local_328.m_data[1] = 1.0;
  local_328.m_data[2] = 1.0;
  sglr::drawQuad(ctx,program,&local_338,&local_328);
  (*ctx->_vptr_Context[0x34])(ctx,0xb71);
  (*ctx->_vptr_Context[0x35])(ctx,0x202,(ulong)(2 - (GVar1 == 0)),0xff);
  (*ctx->_vptr_Context[0x36])(ctx,0x1e03,0x1e00,0x1e00);
  local_338.m_data[0] = 0.0;
  local_338.m_data[1] = 1.0;
  local_338.m_data[2] = 0.0;
  uStack_32c = 0x3f800000;
  (*ctx->_vptr_Context[0x76])(ctx,(ulong)uVar2);
  uVar3 = (*ctx->_vptr_Context[0x66])(ctx,(ulong)uVar2,"u_color");
  (*ctx->_vptr_Context[0x5f])(ctx,(ulong)uVar3,1,&local_338);
  local_338.m_data[0] = -0.5;
  local_338.m_data[1] = -0.5;
  local_338.m_data[2] = 0.0;
  local_328.m_data._0_8_ = &DAT_3f0000003f000000;
  local_328.m_data[2] = 0.0;
  sglr::drawQuad(ctx,uVar2,&local_338,&local_328);
  (*ctx->_vptr_Context[6])(ctx,0xde1,2);
  (*ctx->_vptr_Context[0x35])(ctx,0x204,(ulong)((GVar1 == 0) + 1),0xff);
  (*ctx->_vptr_Context[0x36])(ctx,0x1e00,0x1e00,0x1e00);
  local_338.m_data[0] = -1.0;
  local_338.m_data[1] = -1.0;
  local_338.m_data[2] = 0.0;
  local_328.m_data[0] = 1.0;
  local_328.m_data[1] = 1.0;
  local_328.m_data[2] = 0.0;
  sglr::drawQuad(ctx,program,&local_338,&local_328);
  (*ctx->_vptr_Context[0x34])(ctx,0xb90);
  pp_Var5 = ctx->_vptr_Context;
  if (fbo.m_config.colorbufferType == 0xde1) {
    (*pp_Var5[9])(ctx,0x8d40,0);
    (*ctx->_vptr_Context[4])(ctx,0x84c0);
    (*ctx->_vptr_Context[6])(ctx,0xde1,(ulong)fbo.m_colorbuffer);
    uVar4 = (*ctx->_vptr_Context[2])(ctx);
    uVar2 = (*ctx->_vptr_Context[3])(ctx);
    (*ctx->_vptr_Context[5])(ctx,0,0,(ulong)uVar4,(ulong)uVar2);
    local_338.m_data[0] = -1.0;
    local_338.m_data[1] = -1.0;
    local_338.m_data[2] = 0.0;
    local_328.m_data[0] = 1.0;
    local_328.m_data[1] = 1.0;
    local_328.m_data[2] = 0.0;
    sglr::drawQuad(ctx,program,&local_338,&local_328);
    local_33c = (*ctx->_vptr_Context[2])(ctx);
    uVar4 = (*ctx->_vptr_Context[3])(ctx);
    pp_Var5 = ctx->_vptr_Context;
  }
  (*pp_Var5[0x80])(ctx,local_318,0,0,(ulong)local_33c,(ulong)uVar4);
  Functional::Framebuffer::~Framebuffer(&fbo);
  sglr::ShaderProgram::~ShaderProgram(&texShader.super_ShaderProgram);
  sglr::ShaderProgram::~ShaderProgram(&colorShader.super_ShaderProgram);
  return;
}

Assistant:

void StencilTest::render (sglr::Context& ctx, Surface& dst)
{
	FlatColorShader		colorShader;
	SingleTex2DShader	texShader;
	deUint32			colorShaderID	= ctx.createProgram(&colorShader);
	deUint32			texShaderID		= ctx.createProgram(&texShader);
	int					width			= m_fboWidth;
	int					height			= m_fboHeight;
	int					texWidth		= 64;
	int					texHeight		= 64;
	deUint32			quadsTex		= 1;
	deUint32			metaballsTex	= 2;
	bool				depth			= getConfig().depthbufferType != GL_NONE;

	createQuadsTex2D(ctx, quadsTex, GL_RGB, GL_UNSIGNED_BYTE, texWidth, texHeight);
	createMetaballsTex2D(ctx, metaballsTex, GL_RGB, GL_UNSIGNED_BYTE, texWidth, texHeight);

	Framebuffer fbo(ctx, getConfig(), width, height);
	fbo.checkCompleteness();

	// Bind framebuffer and clear
	ctx.bindFramebuffer(GL_FRAMEBUFFER, fbo.getFramebuffer());
	ctx.viewport(0, 0, width, height);
	ctx.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	ctx.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	// Render intersecting quads - increment stencil on depth pass
	ctx.enable(GL_DEPTH_TEST);
	ctx.enable(GL_STENCIL_TEST);
	ctx.stencilFunc(GL_ALWAYS, 0, 0xffu);
	ctx.stencilOp(GL_KEEP, GL_KEEP, GL_INCR);

	colorShader.setColor(ctx, colorShaderID, Vec4(0.0f, 0.0f, 1.0f, 1.0f));
	sglr::drawQuad(ctx, colorShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(+1.0f, +1.0f, 0.0f));

	ctx.bindTexture(GL_TEXTURE_2D, quadsTex);
	texShader.setUnit(ctx, texShaderID, 0);
	sglr::drawQuad(ctx, texShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(+1.0f, +1.0f, +1.0f));

	// Draw quad with stencil test (stencil == 1 or 2 depending on depth) - decrement on stencil failure
	ctx.disable(GL_DEPTH_TEST);
	ctx.stencilFunc(GL_EQUAL, depth ? 2 : 1, 0xffu);
	ctx.stencilOp(GL_DECR, GL_KEEP, GL_KEEP);
	colorShader.setColor(ctx, colorShaderID, Vec4(0.0f, 1.0f, 0.0f, 1.0f));
	sglr::drawQuad(ctx, colorShaderID, Vec3(-0.5f, -0.5f, 0.0f), Vec3(+0.5f, +0.5f, 0.0f));

	// Draw metaballs with stencil test where stencil > 1 or 2 depending on depth buffer
	ctx.bindTexture(GL_TEXTURE_2D, metaballsTex);
	ctx.stencilFunc(GL_GREATER, depth ? 1 : 2, 0xffu);
	ctx.stencilOp(GL_KEEP, GL_KEEP, GL_KEEP);
	sglr::drawQuad(ctx, texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(+1.0f, +1.0f, 0.0f));

	ctx.disable(GL_STENCIL_TEST);

	if (fbo.getConfig().colorbufferType == GL_TEXTURE_2D)
	{
		ctx.bindFramebuffer(GL_FRAMEBUFFER, 0);
		ctx.activeTexture(GL_TEXTURE0);
		ctx.bindTexture(GL_TEXTURE_2D, fbo.getColorbuffer());
		ctx.viewport(0, 0, ctx.getWidth(), ctx.getHeight());
		sglr::drawQuad(ctx, texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		ctx.readPixels(dst, 0, 0, ctx.getWidth(), ctx.getHeight());
	}
	else
		ctx.readPixels(dst, 0, 0, width, height);
}